

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_idwt53_v(opj_dwt_t *dwt,OPJ_INT32 *tiledp_col,OPJ_SIZE_T stride,OPJ_INT32 nb_cols)

{
  int sn_00;
  int *piVar1;
  int len_00;
  int *piVar2;
  int local_5c;
  OPJ_INT32 c_3;
  OPJ_INT32 *in_odd;
  OPJ_INT32 *in_even;
  OPJ_INT32 i;
  OPJ_INT32 *out;
  OPJ_INT32 c_2;
  OPJ_INT32 c_1;
  OPJ_INT32 c;
  OPJ_INT32 len;
  OPJ_INT32 sn;
  OPJ_INT32 nb_cols_local;
  OPJ_SIZE_T stride_local;
  OPJ_INT32 *tiledp_col_local;
  opj_dwt_t *dwt_local;
  
  sn_00 = dwt->sn;
  len_00 = sn_00 + dwt->dn;
  stride_local = (OPJ_SIZE_T)tiledp_col;
  if (dwt->cas == 0) {
    if ((len_00 < 2) || (nb_cols != 8)) {
      if (1 < len_00) {
        for (c_2 = 0; c_2 < nb_cols; c_2 = c_2 + 1) {
          opj_idwt3_v_cas0(dwt->mem,sn_00,len_00,(OPJ_INT32 *)stride_local,stride);
          stride_local = stride_local + 4;
        }
      }
    }
    else {
      opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(dwt->mem,sn_00,len_00,tiledp_col,stride);
    }
  }
  else if (len_00 == 1) {
    for (out._4_4_ = 0; out._4_4_ < nb_cols; out._4_4_ = out._4_4_ + 1) {
      *(int *)stride_local = *(int *)stride_local / 2;
      stride_local = stride_local + 4;
    }
  }
  else if (len_00 == 2) {
    piVar1 = dwt->mem;
    for (out._0_4_ = 0; (int)out < nb_cols; out._0_4_ = (int)out + 1) {
      piVar2 = (int *)(stride_local + (long)sn_00 * stride * 4);
      piVar1[1] = *(int *)stride_local - (*piVar2 + 1 >> 1);
      *piVar1 = *piVar2 + piVar1[1];
      for (in_even._4_4_ = 0; in_even._4_4_ < 2; in_even._4_4_ = in_even._4_4_ + 1) {
        *(int *)(stride_local + (long)in_even._4_4_ * stride * 4) = piVar1[in_even._4_4_];
      }
      stride_local = stride_local + 4;
    }
  }
  else if ((len_00 < 3) || (nb_cols != 8)) {
    if (2 < len_00) {
      for (local_5c = 0; local_5c < nb_cols; local_5c = local_5c + 1) {
        opj_idwt3_v_cas1(dwt->mem,sn_00,len_00,(OPJ_INT32 *)stride_local,stride);
        stride_local = stride_local + 4;
      }
    }
  }
  else {
    opj_idwt53_v_cas1_mcols_SSE2_OR_AVX2(dwt->mem,sn_00,len_00,tiledp_col,stride);
  }
  return;
}

Assistant:

static void opj_idwt53_v(const opj_dwt_t *dwt,
                         OPJ_INT32* tiledp_col,
                         OPJ_SIZE_T stride,
                         OPJ_INT32 nb_cols)
{
#ifdef STANDARD_SLOW_VERSION
    /* For documentation purpose */
    OPJ_INT32 k, c;
    for (c = 0; c < nb_cols; c ++) {
        opj_dwt_interleave_v(dwt, tiledp_col + c, stride);
        opj_dwt_decode_1(dwt);
        for (k = 0; k < dwt->sn + dwt->dn; ++k) {
            tiledp_col[c + k * stride] = dwt->mem[k];
        }
    }
#else
    const OPJ_INT32 sn = dwt->sn;
    const OPJ_INT32 len = sn + dwt->dn;
    if (dwt->cas == 0) {
        /* If len == 1, unmodified value */

#if (defined(__SSE2__) || defined(__AVX2__))
        if (len > 1 && nb_cols == PARALLEL_COLS_53) {
            /* Same as below general case, except that thanks to SSE2/AVX2 */
            /* we can efficiently process 8/16 columns in parallel */
            opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(dwt->mem, sn, len, tiledp_col, stride);
            return;
        }
#endif
        if (len > 1) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                opj_idwt3_v_cas0(dwt->mem, sn, len, tiledp_col, stride);
            }
            return;
        }
    } else {
        if (len == 1) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                tiledp_col[0] /= 2;
            }
            return;
        }

        if (len == 2) {
            OPJ_INT32 c;
            OPJ_INT32* out = dwt->mem;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                OPJ_INT32 i;
                const OPJ_INT32* in_even = &tiledp_col[(OPJ_SIZE_T)sn * stride];
                const OPJ_INT32* in_odd = &tiledp_col[0];

                out[1] = in_odd[0] - ((in_even[0] + 1) >> 1);
                out[0] = in_even[0] + out[1];

                for (i = 0; i < len; ++i) {
                    tiledp_col[(OPJ_SIZE_T)i * stride] = out[i];
                }
            }

            return;
        }

#if (defined(__SSE2__) || defined(__AVX2__))
        if (len > 2 && nb_cols == PARALLEL_COLS_53) {
            /* Same as below general case, except that thanks to SSE2/AVX2 */
            /* we can efficiently process 8/16 columns in parallel */
            opj_idwt53_v_cas1_mcols_SSE2_OR_AVX2(dwt->mem, sn, len, tiledp_col, stride);
            return;
        }
#endif
        if (len > 2) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                opj_idwt3_v_cas1(dwt->mem, sn, len, tiledp_col, stride);
            }
            return;
        }
    }
#endif
}